

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<const_std::pair<const_int,_int>_&> * __thiscall
testing::internal::MatcherBase<const_std::pair<const_int,_int>_&>::operator=
          (MatcherBase<const_std::pair<const_int,_int>_&> *this,
          MatcherBase<const_std::pair<const_int,_int>_&> *other)

{
  MatcherBase<const_std::pair<const_int,_int>_&> *other_local;
  MatcherBase<const_std::pair<const_int,_int>_&> *this_local;
  
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }